

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::PropagateSimpleDatePartStatistics<0l,24l>
          (duckdb *this,vector<duckdb::BaseStatistics,_true> *child_stats)

{
  reference stats;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> extraout_RAX
  ;
  BaseStatistics result;
  Value VStack_c8;
  LogicalType local_88;
  BaseStatistics local_70;
  
  LogicalType::LogicalType(&local_88,BIGINT);
  NumericStats::CreateEmpty(&local_70,&local_88);
  LogicalType::~LogicalType(&local_88);
  stats = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  BaseStatistics::CopyValidity(&local_70,stats);
  Value::BIGINT(&VStack_c8,0);
  NumericStats::SetMin(&local_70,&VStack_c8);
  Value::~Value(&VStack_c8);
  Value::BIGINT(&VStack_c8,0x18);
  NumericStats::SetMax(&local_70,&VStack_c8);
  Value::~Value(&VStack_c8);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_70);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>)
         extraout_RAX.
         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateSimpleDatePartStatistics(vector<BaseStatistics> &child_stats) {
	// we can always propagate simple date part statistics
	// since the min and max can never exceed these bounds
	auto result = NumericStats::CreateEmpty(LogicalType::BIGINT);
	result.CopyValidity(child_stats[0]);
	NumericStats::SetMin(result, Value::BIGINT(MIN));
	NumericStats::SetMax(result, Value::BIGINT(MAX));
	return result.ToUnique();
}